

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O1

tuple<unsigned_long,_unsigned_long,_long> * __thiscall
greater_filtration_or_better_pivot_or_smaller_index::get_coboundary_size_and_gap_and_pivot
          (tuple<unsigned_long,_unsigned_long,_long> *__return_storage_ptr__,
          greater_filtration_or_better_pivot_or_smaller_index *this,index_t a)

{
  long lVar1;
  long lVar2;
  long lVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  
  lVar3 = *(long *)&(this->complex->cells).
                    super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->dimension].
                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>;
  lVar1 = *(long *)(lVar3 + a * 0xe8);
  lVar3 = *(long *)(lVar3 + 8 + a * 0xe8) - lVar1;
  if (lVar3 == 0) {
    uVar4 = 0;
    uVar5 = 0;
    lVar3 = 0;
  }
  else {
    lVar3 = lVar3 >> 3;
    uVar4 = lVar3 + (ulong)(lVar3 == 0);
    lVar3 = 0;
    uVar5 = 0;
    uVar6 = 0;
    do {
      lVar2 = *(long *)(lVar1 + uVar6 * 8);
      uVar6 = uVar6 + 1;
      uVar7 = lVar2 - lVar3;
      if (uVar7 != 0 && lVar3 <= lVar2) {
        lVar3 = lVar2;
        uVar5 = uVar7;
      }
    } while (uVar4 != uVar6);
  }
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_long>).
  super__Tuple_impl<1UL,_unsigned_long,_long>.super__Tuple_impl<2UL,_long>.
  super__Head_base<2UL,_long,_false>._M_head_impl = lVar3;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_long>).
  super__Tuple_impl<1UL,_unsigned_long,_long>.super__Head_base<1UL,_unsigned_long,_false>.
  _M_head_impl = uVar5;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_long>).
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar4;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<size_t, size_t, index_t> get_coboundary_size_and_gap_and_pivot(index_t a) const {
		// Look at the first two gaps of the pivot and the next element
		index_t pivot = 0;
		size_t gap_after_pivot = 0;
		simplex_coboundary_enumerator iterator(a,dimension,complex);
		size_t coboundary_size = 0;
		while (iterator.has_next()) {
			coboundary_size++;
			index_t next_index = get_index(iterator.next().second);
			if (next_index > pivot) {
				gap_after_pivot = next_index - pivot;
				pivot = next_index;
			}
		}

		return std::make_tuple(coboundary_size, gap_after_pivot, pivot);
	}